

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

void __thiscall
kj::_::HeapDisposer<kj::(anonymous_namespace)::InMemoryFile::WritableFileMappingImpl>::disposeImpl
          (HeapDisposer<kj::(anonymous_namespace)::InMemoryFile::WritableFileMappingImpl> *this,
          void *pointer)

{
  Maybe<kj::_::Mutex::Waiter_&> local_20;
  
  if (pointer != (void *)0x0) {
    MutexGuarded<kj::(anonymous_namespace)::InMemoryFile::Impl>::lockExclusive
              ((MutexGuarded<kj::(anonymous_namespace)::InMemoryFile::Impl> *)
               &stack0xffffffffffffffd8,*(long *)((long)pointer + 0x10) + 0x18);
    *(uint *)&local_20.ptr[1].next.ptr = *(uint *)&local_20.ptr[1].next.ptr - 1;
    Locked<kj::(anonymous_namespace)::InMemoryFile::Impl>::~Locked
              ((Locked<kj::(anonymous_namespace)::InMemoryFile::Impl> *)&stack0xffffffffffffffd8);
    Own<const_kj::(anonymous_namespace)::InMemoryFile,_std::nullptr_t>::~Own
              ((Own<const_kj::(anonymous_namespace)::InMemoryFile,_std::nullptr_t> *)
               ((long)pointer + 8));
  }
  operator_delete(pointer,0x28);
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }